

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

int32_t __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
DecodeHoleAndTopologySplitEvents
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          DecoderBuffer *decoder_buffer)

{
  long lVar1;
  pointer *ppTVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  CornerTable *pCVar7;
  long lVar8;
  iterator iVar9;
  pointer pTVar10;
  iterator iVar11;
  bool bVar12;
  uint8_t edge_data;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint32_t uVar16;
  ulong uVar17;
  int iVar18;
  uint32_t delta;
  uint32_t num_hole_events;
  uint32_t num_topology_splits;
  uint32_t delta_1;
  HoleEventData local_58;
  TopologySplitEventData local_54;
  vector<draco::HoleEventData,std::allocator<draco::HoleEventData>> *local_48;
  uint local_40;
  uint local_3c;
  vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>> *local_38;
  
  if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    lVar14 = decoder_buffer->pos_ + 4;
    if (decoder_buffer->data_size_ < lVar14) {
      return -1;
    }
    local_40 = *(uint *)(decoder_buffer->data_ + decoder_buffer->pos_);
    decoder_buffer->pos_ = lVar14;
  }
  else {
    bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_40,decoder_buffer);
    if (!bVar12) {
      return -1;
    }
  }
  uVar17 = (ulong)local_40;
  if (uVar17 != 0) {
    pCVar7 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    if ((uint)((ulong)((long)*(pointer *)((long)&(pCVar7->corner_to_vertex_map_).vector_ + 8) -
                       *(long *)&(pCVar7->corner_to_vertex_map_).vector_ >> 2) / 3) < local_40) {
      return -1;
    }
    uVar4._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar4._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    if ((ushort)(uVar4 << 8 | uVar4 >> 8) < 0x102) {
      do {
        lVar14 = decoder_buffer->data_size_;
        lVar8 = decoder_buffer->pos_;
        if (lVar14 < lVar8 + 4) {
          return -1;
        }
        local_54.split_symbol_id = *(uint32_t *)(decoder_buffer->data_ + lVar8);
        decoder_buffer->pos_ = lVar8 + 4;
        lVar1 = lVar8 + 8;
        if (lVar14 < lVar1) {
          return -1;
        }
        local_54.source_symbol_id = *(uint32_t *)(decoder_buffer->data_ + lVar8 + 4);
        decoder_buffer->pos_ = lVar1;
        if (lVar14 < lVar8 + 9) {
          return -1;
        }
        bVar3 = decoder_buffer->data_[lVar1];
        decoder_buffer->pos_ = lVar8 + 9;
        local_54._8_1_ = local_54._8_1_ & 0xfe | bVar3 & 1;
        iVar9._M_current =
             (this->topology_split_data_).
             super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->topology_split_data_).
            super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>::
          _M_realloc_insert<draco::TopologySplitEventData_const&>
                    ((vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>
                      *)&this->topology_split_data_,iVar9,&local_54);
        }
        else {
          *(undefined4 *)&(iVar9._M_current)->field_0x8 = local_54._8_4_;
          (iVar9._M_current)->split_symbol_id = local_54.split_symbol_id;
          (iVar9._M_current)->source_symbol_id = local_54.source_symbol_id;
          ppTVar2 = &(this->topology_split_data_).
                     super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar2 = *ppTVar2 + 1;
        }
        uVar15 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar15;
      } while (uVar15 != 0);
    }
    else {
      local_38 = (vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>
                  *)&this->topology_split_data_;
      local_48 = (vector<draco::HoleEventData,std::allocator<draco::HoleEventData>> *)
                 ((ulong)local_48 & 0xffffffff00000000);
      uVar15 = local_40;
      do {
        bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>
                           (1,(uint *)&local_58,decoder_buffer);
        if (bVar12) {
          uVar13 = local_58.symbol_id + (int)local_48;
          local_54.source_symbol_id = uVar13;
          bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>
                             (1,(uint *)&local_58,decoder_buffer);
          if ((!bVar12) || (uVar16 = uVar13 - local_58.symbol_id, uVar13 < (uint)local_58.symbol_id)
             ) goto LAB_00130d63;
          iVar9._M_current =
               (this->topology_split_data_).
               super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_54.split_symbol_id = uVar16;
          if (iVar9._M_current ==
              (this->topology_split_data_).
              super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<draco::TopologySplitEventData,std::allocator<draco::TopologySplitEventData>>
            ::_M_realloc_insert<draco::TopologySplitEventData_const&>(local_38,iVar9,&local_54);
          }
          else {
            *(undefined4 *)&(iVar9._M_current)->field_0x8 = local_54._8_4_;
            (iVar9._M_current)->split_symbol_id = uVar16;
            (iVar9._M_current)->source_symbol_id = local_54.source_symbol_id;
            ppTVar2 = &(this->topology_split_data_).
                       super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar2 = *ppTVar2 + 1;
          }
          bVar12 = true;
          local_48 = (vector<draco::HoleEventData,std::allocator<draco::HoleEventData>> *)
                     CONCAT44(local_48._4_4_,uVar13);
        }
        else {
LAB_00130d63:
          bVar12 = false;
        }
        if (!bVar12) {
          return -1;
        }
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      lVar14 = 0;
      DecoderBuffer::StartBitDecoding(decoder_buffer,false,(uint64_t *)0x0);
      do {
        uVar5._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
        uVar5._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
        DecoderBuffer::DecodeLeastSignificantBits32
                  (decoder_buffer,((ushort)(uVar5 << 8 | uVar5 >> 8) < 0x202) + 1,
                   &local_54.split_symbol_id);
        pTVar10 = (this->topology_split_data_).
                  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (&pTVar10->field_0x8)[lVar14] =
             (&pTVar10->field_0x8)[lVar14] & 0xfe | (byte)local_54.split_symbol_id & 1;
        lVar14 = lVar14 + 0xc;
      } while (uVar17 * 0xc != lVar14);
      DecoderBuffer::EndBitDecoding(decoder_buffer);
    }
  }
  local_54.split_symbol_id = 0;
  bVar3 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  if (bVar3 < 2) {
    lVar14 = decoder_buffer->pos_ + 4;
    if (decoder_buffer->data_size_ < lVar14) {
      return -1;
    }
    local_54.split_symbol_id = *(uint32_t *)(decoder_buffer->data_ + decoder_buffer->pos_);
    decoder_buffer->pos_ = lVar14;
  }
  else if ((CONCAT11(bVar3,(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                           version_minor_) < 0x201) &&
          (bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>
                              (1,&local_54.split_symbol_id,decoder_buffer), !bVar12)) {
    return -1;
  }
  if (local_54.split_symbol_id != 0) {
    uVar6._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar6._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    if ((ushort)(uVar6 << 8 | uVar6 >> 8) < 0x102) {
      uVar16 = local_54.split_symbol_id;
      do {
        lVar14 = decoder_buffer->pos_ + 4;
        if (decoder_buffer->data_size_ < lVar14) {
          return -1;
        }
        local_58.symbol_id = *(int32_t *)(decoder_buffer->data_ + decoder_buffer->pos_);
        decoder_buffer->pos_ = lVar14;
        iVar11._M_current =
             (this->hole_event_data_).
             super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->hole_event_data_).
            super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<draco::HoleEventData,std::allocator<draco::HoleEventData>>::
          _M_realloc_insert<draco::HoleEventData_const&>
                    ((vector<draco::HoleEventData,std::allocator<draco::HoleEventData>> *)
                     &this->hole_event_data_,iVar11,&local_58);
        }
        else {
          (iVar11._M_current)->symbol_id = local_58.symbol_id;
          (this->hole_event_data_).
          super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    else {
      local_48 = (vector<draco::HoleEventData,std::allocator<draco::HoleEventData>> *)
                 &this->hole_event_data_;
      iVar18 = 0;
      uVar16 = local_54.split_symbol_id;
      do {
        local_58.symbol_id = 0;
        bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_3c,decoder_buffer);
        if (bVar12) {
          iVar18 = iVar18 + local_3c;
          iVar11._M_current =
               (this->hole_event_data_).
               super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (this->hole_event_data_).
              super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58.symbol_id = iVar18;
            std::vector<draco::HoleEventData,std::allocator<draco::HoleEventData>>::
            _M_realloc_insert<draco::HoleEventData_const&>(local_48,iVar11,&local_58);
          }
          else {
            (iVar11._M_current)->symbol_id = iVar18;
            (this->hole_event_data_).
            super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
        }
        if (!bVar12) {
          return -1;
        }
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
  }
  return (int32_t)decoder_buffer->pos_;
}

Assistant:

int32_t
MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeHoleAndTopologySplitEvents(
    DecoderBuffer *decoder_buffer) {
  // Prepare a new decoder from the provided buffer offset.
  uint32_t num_topology_splits;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_topology_splits)) {
      return -1;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_topology_splits, decoder_buffer)) {
      return -1;
    }
  }
  if (num_topology_splits > 0) {
    if (num_topology_splits >
        static_cast<uint32_t>(corner_table_->num_faces())) {
      return -1;
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        if (!decoder_buffer->Decode(&event_data.split_symbol_id)) {
          return -1;
        }
        if (!decoder_buffer->Decode(&event_data.source_symbol_id)) {
          return -1;
        }
        uint8_t edge_data;
        if (!decoder_buffer->Decode(&edge_data)) {
          return -1;
        }
        event_data.source_edge = edge_data & 1;
        topology_split_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode source and split symbol ids using delta and varint coding. See
      // description in mesh_edgebreaker_encoder_impl.cc for more details.
      int last_source_symbol_id = 0;
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.source_symbol_id = delta + last_source_symbol_id;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        if (delta > event_data.source_symbol_id) {
          return -1;
        }
        event_data.split_symbol_id =
            event_data.source_symbol_id - static_cast<int32_t>(delta);
        last_source_symbol_id = event_data.source_symbol_id;
        topology_split_data_.push_back(event_data);
      }
      // Split edges are decoded from a direct bit decoder.
      decoder_buffer->StartBitDecoding(false, nullptr);
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        uint32_t edge_data;
        if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
          decoder_buffer->DecodeLeastSignificantBits32(2, &edge_data);
        } else {
          decoder_buffer->DecodeLeastSignificantBits32(1, &edge_data);
        }
        TopologySplitEventData &event_data = topology_split_data_[i];
        event_data.source_edge = edge_data & 1;
      }
      decoder_buffer->EndBitDecoding();
    }
  }
  uint32_t num_hole_events = 0;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_hole_events)) {
      return -1;
    }
  } else if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
    if (!DecodeVarint(&num_hole_events, decoder_buffer)) {
      return -1;
    }
  }
#endif
  if (num_hole_events > 0) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        if (!decoder_buffer->Decode(&event_data)) {
          return -1;
        }
        hole_event_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode hole symbol ids using delta and varint coding.
      int last_symbol_id = 0;
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.symbol_id = delta + last_symbol_id;
        last_symbol_id = event_data.symbol_id;
        hole_event_data_.push_back(event_data);
      }
    }
  }
  return static_cast<int32_t>(decoder_buffer->decoded_size());
}